

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

AttributeSpec *
deqp::gls::DrawTestSpec::AttributeSpec::createAttributeArray
          (InputType inputType,OutputType outputType,Storage storage,Usage usage,int componentCount,
          int offset,int stride,bool normalize,int instanceDivisor)

{
  AttributeSpec *in_RDI;
  int in_stack_00000008;
  int in_stack_00000010;
  
  in_RDI->storage = STORAGE_LAST;
  in_RDI->usage = USAGE_LAST;
  in_RDI->componentCount = 0;
  in_RDI->offset = 0;
  *(undefined8 *)((long)&in_RDI->offset + 1) = 0;
  in_RDI->instanceDivisor = 0;
  *(undefined4 *)((long)&in_RDI->instanceDivisor + 3) = 0;
  in_RDI->inputType = inputType;
  in_RDI->outputType = outputType;
  in_RDI->storage = storage;
  in_RDI->usage = usage;
  in_RDI->componentCount = componentCount;
  in_RDI->offset = in_stack_00000008;
  in_RDI->stride = in_stack_00000010;
  in_RDI->normalize = offset._0_1_;
  in_RDI->instanceDivisor = stride;
  in_RDI->useDefaultAttribute = false;
  return in_RDI;
}

Assistant:

DrawTestSpec::AttributeSpec	DrawTestSpec::AttributeSpec::createAttributeArray (InputType inputType, OutputType outputType, Storage storage, Usage usage, int componentCount, int offset, int stride, bool normalize, int instanceDivisor)
{
	DrawTestSpec::AttributeSpec spec;

	spec.inputType			= inputType;
	spec.outputType			= outputType;
	spec.storage			= storage;
	spec.usage				= usage;
	spec.componentCount		= componentCount;
	spec.offset				= offset;
	spec.stride				= stride;
	spec.normalize			= normalize;
	spec.instanceDivisor	= instanceDivisor;

	spec.useDefaultAttribute= false;

	return spec;
}